

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::CleanupTemporaryCoins(MemPoolAccept *this)

{
  long lVar1;
  bool bVar2;
  CCoinsViewMemPool *in_RDI;
  long in_FS_OFFSET;
  COutPoint *outpoint;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  CCoinsViewMemPool *in_stack_ffffffffffffff68;
  COutPoint *in_stack_ffffffffffffff78;
  CCoinsViewCache *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CCoinsViewMemPool::GetNonBaseCoins(in_RDI);
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::begin((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
           *)in_RDI);
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::end((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
         *)in_RDI);
  while( true ) {
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<COutPoint,_false> *)in_stack_ffffffffffffff78,
                       (_Node_iterator_base<COutPoint,_false> *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::__detail::_Node_iterator<COutPoint,_true,_false>::operator*
              ((_Node_iterator<COutPoint,_true,_false> *)in_stack_ffffffffffffff68);
    CCoinsViewCache::Uncache(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__detail::_Node_iterator<COutPoint,_true,_false>::operator++
              ((_Node_iterator<COutPoint,_true,_false> *)in_stack_ffffffffffffff68);
  }
  std::
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  ::~unordered_set((unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
                    *)in_stack_ffffffffffffff68);
  CCoinsViewMemPool::Reset(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MemPoolAccept::CleanupTemporaryCoins()
{
    // There are 3 kinds of coins in m_view:
    // (1) Temporary coins from the transactions in subpackage, constructed by m_viewmempool.
    // (2) Mempool coins from transactions in the mempool, constructed by m_viewmempool.
    // (3) Confirmed coins fetched from our current UTXO set.
    //
    // (1) Temporary coins need to be removed, regardless of whether the transaction was submitted.
    // If the transaction was submitted to the mempool, m_viewmempool will be able to fetch them from
    // there. If it wasn't submitted to mempool, it is incorrect to keep them - future calls may try
    // to spend those coins that don't actually exist.
    // (2) Mempool coins also need to be removed. If the mempool contents have changed as a result
    // of submitting or replacing transactions, coins previously fetched from mempool may now be
    // spent or nonexistent. Those coins need to be deleted from m_view.
    // (3) Confirmed coins don't need to be removed. The chainstate has not changed (we are
    // holding cs_main and no blocks have been processed) so the confirmed tx cannot disappear like
    // a mempool tx can. The coin may now be spent after we submitted a tx to mempool, but
    // we have already checked that the package does not have 2 transactions spending the same coin.
    // Keeping them in m_view is an optimization to not re-fetch confirmed coins if we later look up
    // inputs for this transaction again.
    for (const auto& outpoint : m_viewmempool.GetNonBaseCoins()) {
        // In addition to resetting m_viewmempool, we also need to manually delete these coins from
        // m_view because it caches copies of the coins it fetched from m_viewmempool previously.
        m_view.Uncache(outpoint);
    }
    // This deletes the temporary and mempool coins.
    m_viewmempool.Reset();
}